

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O3

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::cannotBuildNodeDueToMultipleProducers
          (BuildSystemFrontendDelegate *this,Node *output,
          vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
          *commands)

{
  pointer ppCVar1;
  Command *pCVar2;
  StringRef Str;
  StringRef Str_00;
  raw_ostream *prVar3;
  pointer ppCVar4;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  string message;
  raw_string_ostream messageStream;
  
  message._M_dataplus._M_p = (pointer)&message.field_2;
  message._M_string_length = 0;
  message.field_2._M_local_buf[0] = '\0';
  messageStream.super_raw_ostream.BufferMode = InternalBuffer;
  messageStream.super_raw_ostream.OutBufStart = (char *)0x0;
  messageStream.super_raw_ostream.OutBufEnd = (char *)0x0;
  messageStream.super_raw_ostream.OutBufCur = (char *)0x0;
  messageStream.super_raw_ostream._vptr_raw_ostream =
       (_func_int **)&PTR__raw_string_ostream_0020d278;
  messageStream.OS = &message;
  Str_01.Length = 0x17;
  Str_01.Data = "unable to build node: \'";
  llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,Str_01);
  Str.Data = (output->name)._M_dataplus._M_p;
  Str.Length = (output->name)._M_string_length;
  llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,Str);
  Str_02.Length = 0x2b;
  Str_02.Data = "\' (node is produced by multiple commands: \'";
  llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,Str_02);
  ppCVar1 = (commands->
            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar4 = (commands->
                 super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppCVar4 != ppCVar1;
      ppCVar4 = ppCVar4 + 1) {
    pCVar2 = *ppCVar4;
    if (pCVar2 != *(commands->
                   super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                   )._M_impl.super__Vector_impl_data._M_start) {
      Str_03.Length = 2;
      Str_03.Data = ", ";
      llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,Str_03);
    }
    Str_04.Length = 1;
    Str_04.Data = "\'";
    prVar3 = llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,Str_04);
    Str_00.Data = (pCVar2->name)._M_dataplus._M_p;
    Str_00.Length = (pCVar2->name)._M_string_length;
    prVar3 = llvm::raw_ostream::operator<<(prVar3,Str_00);
    Str_05.Length = 1;
    Str_05.Data = "\'";
    llvm::raw_ostream::operator<<(prVar3,Str_05);
  }
  if (messageStream.super_raw_ostream.OutBufCur != messageStream.super_raw_ostream.OutBufStart) {
    llvm::raw_ostream::flush_nonempty(&messageStream.super_raw_ostream);
  }
  fwrite(message._M_dataplus._M_p,message._M_string_length,1,_stderr);
  fflush(_stderr);
  llvm::raw_string_ostream::~raw_string_ostream(&messageStream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)message._M_dataplus._M_p != &message.field_2) {
    operator_delete(message._M_dataplus._M_p,
                    CONCAT71(message.field_2._M_allocated_capacity._1_7_,
                             message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void BuildSystemFrontendDelegate::cannotBuildNodeDueToMultipleProducers(
     Node *output, std::vector<Command*> commands) {
  std::string message;
  llvm::raw_string_ostream messageStream(message);

  messageStream << "unable to build node: '";
  messageStream << output->getName();
  messageStream << "' (node is produced by multiple commands: '";

  for (Command* cmd : commands) {
    if (cmd != *commands.begin()) {
      messageStream << ", ";
    }
    messageStream << "'" << cmd->getName() << "'";
  }

  messageStream.flush();
  fwrite(message.data(), message.size(), 1, stderr);
  fflush(stderr);
}